

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.c
# Opt level: O2

int lre_is_space(int c)

{
  long lVar1;
  long lVar2;
  
  lVar2 = 1;
  while( true ) {
    if (lVar2 == 0xb) {
      return 0;
    }
    if (c < (int)(uint)*(ushort *)(&UNK_0016c0ce + lVar2 * 4)) break;
    lVar1 = lVar2 * 2;
    lVar2 = lVar2 + 1;
    if ((uint)c < (uint)char_range_s[lVar1]) {
      return 1;
    }
  }
  return 0;
}

Assistant:

BOOL lre_is_space(int c)
{
    int i, n, low, high;
    n = (countof(char_range_s) - 1) / 2;
    for(i = 0; i < n; i++) {
        low = char_range_s[2 * i + 1];
        if (c < low)
            return FALSE;
        high = char_range_s[2 * i + 2];
        if (c < high)
            return TRUE;
    }
    return FALSE;
}